

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O2

CURLcode set_trace_config(GlobalConfig *global,char *token)

{
  bool bVar1;
  ushort uVar2;
  int iVar3;
  CURLcode CVar4;
  char *pcVar5;
  ushort uVar6;
  char *pcVar7;
  size_t sVar8;
  char buffer [32];
  
  do {
    if (token == (char *)0x0) {
      return CURLE_OK;
    }
    pcVar5 = strchr(token,0x2c);
    if (pcVar5 == (char *)0x0) {
      sVar8 = strlen(token);
    }
    else {
      sVar8 = (long)pcVar5 - (long)token;
    }
    bVar1 = true;
    if (*token == '+') {
      sVar8 = sVar8 - 1;
      pcVar7 = token + 1;
    }
    else {
      pcVar7 = token;
      if (*token == '-') {
        sVar8 = sVar8 - 1;
        bVar1 = false;
        pcVar7 = token + 1;
      }
    }
    if (sVar8 == 4) {
      iVar3 = curl_strnequal(pcVar7,"time",4);
      if (iVar3 == 0) goto LAB_00112b8e;
      uVar2 = 0xffdf;
      uVar6 = 0x20;
LAB_00112b72:
      if (bVar1 == false) {
        uVar6 = 0;
      }
      *(ushort *)&global->field_0x63 = uVar2 & *(ushort *)&global->field_0x63 | uVar6;
    }
    else {
      if (sVar8 == 3) {
        iVar3 = curl_strnequal(pcVar7,"all",3);
        if (iVar3 == 0) {
          iVar3 = curl_strnequal(pcVar7,"ids",3);
          if (iVar3 != 0) {
            uVar2 = 0xffbf;
            uVar6 = 0x40;
            goto LAB_00112b72;
          }
          goto LAB_00112b8e;
        }
        uVar2 = 0;
        if (bVar1) {
          uVar2 = 0x60;
        }
        *(ushort *)&global->field_0x63 = uVar2 | *(ushort *)&global->field_0x63 & 0xff9f;
      }
      else {
LAB_00112b8e:
        token = buffer;
        curl_msnprintf(token,0x20,"%c%.*s",(bVar1 ^ 1U) * '\x02' + '+',sVar8 & 0xffffffff,pcVar7);
      }
      CVar4 = curl_global_trace(token);
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
    }
    token = (char *)0x0;
    if (pcVar5 != (char *)0x0) {
      token = pcVar5 + 2;
      if (pcVar5[1] != ' ') {
        token = pcVar5 + 1;
      }
    }
  } while( true );
}

Assistant:

static CURLcode set_trace_config(struct GlobalConfig *global,
                                 const char *token)
{
  CURLcode result = CURLE_OK;
  const char *next, *name;
  bool toggle;

  while(token) {
    size_t len;
    next = strchr(token, ',');

    if(next)
      len = next - token;
    else
      len = strlen(token);

    switch(*token) {
      case '-':
        toggle = FALSE;
        name = token + 1;
        len--;
        break;
      case '+':
        toggle = TRUE;
        name = token + 1;
        len--;
        break;
      default:
        toggle = TRUE;
        name = token;
        break;
    }

    if((len == 3) && strncasecompare(name, "all", 3)) {
      global->traceids = toggle;
      global->tracetime = toggle;
      result = curl_global_trace(token);
      if(result)
        goto out;
    }
    else if((len == 3) && strncasecompare(name, "ids", 3)) {
      global->traceids = toggle;
    }
    else if((len == 4) && strncasecompare(name, "time", 4)) {
      global->tracetime = toggle;
    }
    else {
      char buffer[32];
      msnprintf(buffer, sizeof(buffer), "%c%.*s", toggle ? '+' : '-',
                (int)len, name);
      result = curl_global_trace(buffer);
      if(result)
        goto out;
    }
    if(next) {
      next++;
      if(*next == ' ')
        next++;
    }
    token = next;
  }
out:
  return result;
}